

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

bool_t memIsDisjoint3(void *buf1,size_t count1,void *buf2,size_t count2,void *buf3,size_t count3)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((((count2 == 0 || count1 == 0) || (void *)((long)buf1 + count1) <= buf2) ||
       (void *)((long)buf2 + count2) <= buf1) &&
     (uVar1 = 0,
     ((count3 == 0 || count1 == 0) || (void *)((long)buf1 + count1) <= buf3) ||
     (void *)((long)buf3 + count3) <= buf1)) {
    uVar1 = (uint)((void *)((long)buf3 + count3) <= buf2 ||
                  ((void *)((long)buf2 + count2) <= buf3 || (count2 == 0 || count3 == 0)));
  }
  return uVar1;
}

Assistant:

bool_t memIsDisjoint2(const void* buf1, size_t count1,
	const void* buf2, size_t count2)
{
	ASSERT(memIsValid(buf1, count1));
	ASSERT(memIsValid(buf2, count2));
	return count1 == 0 || count2 == 0 ||
		(const octet*)buf1 + count1 <= (const octet*)buf2 ||
		(const octet*)buf1 >= (const octet*)buf2 + count2;
}